

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

void __thiscall
miniros::MasterLink::setParamImpl<std::__cxx11::string>
          (MasterLink *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *map)

{
  XmlRpcValue *this_00;
  _Base_ptr p_Var1;
  RpcValue xml_value;
  XmlRpcValue local_50;
  XmlRpcValue local_40;
  
  local_50._type = TypeInvalid;
  local_50._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::begin_abi_cxx11_(&local_50);
  for (p_Var1 = (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(map->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,(string *)(p_Var1 + 2));
    this_00 = XmlRpc::XmlRpcValue::operator[](&local_50,(string *)(p_Var1 + 1));
    XmlRpc::XmlRpcValue::operator=(this_00,&local_40);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&local_40);
  }
  set(this,key,&local_50);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_50);
  return;
}

Assistant:

void MasterLink::setParamImpl(const std::string& key, const std::map<std::string, T>& map)
{
  // Note: the XmlRpcValue starts off as "invalid" and assertStruct turns it
  // into a struct type
  RpcValue xml_value;
  xml_value.begin();

  // Copy the contents into the XmlRpcValue
  for (typename std::map<std::string, T>::const_iterator it = map.begin(); it != map.end(); ++it) {
    xml_value[it->first] = it->second;
  }

  this->set(key, xml_value);
}